

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O0

Array<asl::Var> * __thiscall asl::Array<asl::Var>::resize(Array<asl::Var> *this,int m)

{
  int iVar1;
  Data *pDVar2;
  int n;
  int m_local;
  Array<asl::Var> *this_local;
  
  pDVar2 = d(this);
  iVar1 = pDVar2->n;
  reserve(this,m);
  if (iVar1 < m) {
    asl_construct<asl::Var>(this->_a + iVar1,m - iVar1);
  }
  else if (m < iVar1) {
    asl_destroy<asl::Var>(this->_a + m,iVar1 - m);
  }
  pDVar2 = d(this);
  pDVar2->n = m;
  return this;
}

Assistant:

Array& resize(int m)
	{
		int n = d().n;
		reserve(m);
		if (m > n)
			asl_construct(_a + n, m - n);
		else if (m < n)
			asl_destroy(_a + m, n - m);
		d().n = m;
		return *this;
	}